

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnTableSet(SharedValidator *this,Location *loc,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  TableType table_type;
  TableType local_98;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0xd7,loc);
  local_98.limits.max._0_3_ = 0;
  local_98.limits._11_8_ = 0;
  local_98.element.enum_ = Any;
  local_98.element.type_index_ = 0;
  local_98.limits.initial._0_3_ = 0;
  local_98.limits.initial._3_5_ = 0;
  Var::Var(&local_70,table_var);
  RVar2 = CheckTableIndex(this,&local_70,&local_98);
  Var::~Var(&local_70);
  RVar3 = TypeChecker::OnTableSet(&this->typechecker_,local_98.element,&local_98.limits);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableSet(const Location& loc, Var table_var) {
  Result result = CheckInstr(Opcode::TableSet, loc);
  TableType table_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= typechecker_.OnTableSet(table_type.element, table_type.limits);
  return result;
}